

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::setAttributes
          (Compilation *this,Symbol *symbol,
          span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> attributes)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ulong pos0;
  uint uVar7;
  ulong uVar8;
  ulong hash;
  long lVar9;
  ulong uVar10;
  value_type_pointer ppVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  undefined1 auVar16 [16];
  locator res;
  try_emplace_args_t local_71;
  flat_hash_map<const_void_*,_std::span<const_AttributeSymbol_*const>_> *local_70;
  Symbol *local_68;
  ulong local_60;
  pointer local_58;
  size_t local_50;
  locator local_48;
  
  local_50 = (size_t)attributes._M_extent._M_extent_value;
  local_58 = attributes._M_ptr;
  local_70 = &this->attributeMap;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = symbol;
  hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->attributeMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->attributeMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar11 = (this->attributeMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
            .arrays.elements_;
  local_60 = (this->attributeMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
             .arrays.groups_size_mask;
  uVar8 = 0;
  uVar10 = pos0;
  do {
    pgVar2 = pgVar4 + uVar10;
    uVar12 = (uchar)uVar3;
    auVar16[0] = -(pgVar2->m[0].n == uVar12);
    uVar13 = (uchar)((uint)uVar3 >> 8);
    auVar16[1] = -(pgVar2->m[1].n == uVar13);
    uVar14 = (uchar)((uint)uVar3 >> 0x10);
    auVar16[2] = -(pgVar2->m[2].n == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 0x18);
    auVar16[3] = -(pgVar2->m[3].n == uVar15);
    auVar16[4] = -(pgVar2->m[4].n == uVar12);
    auVar16[5] = -(pgVar2->m[5].n == uVar13);
    auVar16[6] = -(pgVar2->m[6].n == uVar14);
    auVar16[7] = -(pgVar2->m[7].n == uVar15);
    auVar16[8] = -(pgVar2->m[8].n == uVar12);
    auVar16[9] = -(pgVar2->m[9].n == uVar13);
    auVar16[10] = -(pgVar2->m[10].n == uVar14);
    auVar16[0xb] = -(pgVar2->m[0xb].n == uVar15);
    auVar16[0xc] = -(pgVar2->m[0xc].n == uVar12);
    auVar16[0xd] = -(pgVar2->m[0xd].n == uVar13);
    auVar16[0xe] = -(pgVar2->m[0xe].n == uVar14);
    auVar16[0xf] = -(pgVar2->m[0xf].n == uVar15);
    for (uVar7 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe); uVar7 != 0;
        uVar7 = uVar7 - 1 & uVar7) {
      uVar5 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if ((Symbol *)ppVar11[uVar10 * 0xf + (ulong)uVar5].first == symbol) {
        ppVar11 = ppVar11 + uVar10 * 0xf + (ulong)uVar5;
        goto LAB_00142c6d;
      }
    }
    if ((pgVar4[uVar10].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
    lVar9 = uVar10 + uVar8;
    uVar8 = uVar8 + 1;
    uVar10 = lVar9 + 1U & local_60;
  } while (uVar8 <= local_60);
  ppVar11 = (value_type_pointer)0x0;
LAB_00142c6d:
  if (ppVar11 == (value_type_pointer)0x0) {
    local_68 = symbol;
    if ((this->attributeMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
        .size_ctrl.size <
        (this->attributeMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
      ::nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,void_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
                  *)local_70,(arrays_type *)local_70,pos0,hash,&local_71,&local_68);
      psVar1 = &(this->attributeMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar11 = local_48.p;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
      ::unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,void_const*>
                (&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<void_const*,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<void_const*,void>,std::equal_to<void_const*>,std::allocator<std::pair<void_const*const,std::span<slang::ast::AttributeSymbol_const*const,18446744073709551615ul>>>>
                  *)local_70,hash,&local_71,&local_68);
      ppVar11 = local_48.p;
    }
  }
  (ppVar11->second)._M_ptr = local_58;
  (ppVar11->second)._M_extent._M_extent_value = local_50;
  return;
}

Assistant:

void Compilation::setAttributes(const Symbol& symbol,
                                std::span<const AttributeSymbol* const> attributes) {
    attributeMap[&symbol] = attributes;
}